

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::HaveCxxStandardAvailable(cmMakefile *this,cmTarget *target,string *feature)

{
  char *pcVar1;
  char **ppcVar2;
  char **ppcVar3;
  ostream *poVar4;
  string *psVar5;
  bool local_6b9;
  char **local_6b8;
  char **local_6b0;
  char **local_6a8;
  char **local_6a0;
  char **needCxxLevel;
  ostringstream local_590 [8];
  ostringstream e_2;
  cmStrCmp local_418;
  char **local_3f8;
  char **existingCxxLevel;
  string local_3e8;
  char *local_3c8;
  char *existingCxxStandard;
  undefined1 local_3b8 [3];
  bool needCxx20;
  bool needCxx17;
  bool needCxx14;
  bool needCxx11;
  bool needCxx98;
  ostringstream local_398 [8];
  ostringstream e_1;
  cmStrCmp local_220;
  string local_200;
  ostringstream local_1e0 [8];
  ostringstream e;
  allocator<char> local_51;
  string local_50;
  char *local_30;
  char *defaultCxxStandard;
  string *feature_local;
  cmTarget *target_local;
  cmMakefile *this_local;
  
  defaultCxxStandard = (char *)feature;
  feature_local = (string *)target;
  target_local = (cmTarget *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_CXX_STANDARD_DEFAULT",&local_51);
  pcVar1 = GetDefinition(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_30 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    std::operator<<((ostream *)local_1e0,
                    "CMAKE_CXX_STANDARD_DEFAULT is not set.  COMPILE_FEATURES support not fully configured for this compiler."
                   );
    std::__cxx11::ostringstream::str();
    IssueMessage(this,INTERNAL_ERROR,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    this_local._7_1_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1e0);
  }
  else {
    ppcVar2 = std::cbegin<char_const*[5]>(&CXX_STANDARDS);
    ppcVar3 = std::cend<char_const*[5]>(&CXX_STANDARDS);
    cmStrCmp::cmStrCmp(&local_220,local_30);
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_220);
    ppcVar3 = std::cend<char_const*[5]>(&CXX_STANDARDS);
    cmStrCmp::~cmStrCmp(&local_220);
    if (ppcVar2 == ppcVar3) {
      std::__cxx11::ostringstream::ostringstream(local_398);
      poVar4 = std::operator<<((ostream *)local_398,
                               "The CMAKE_CXX_STANDARD_DEFAULT variable contains an invalid value: \""
                              );
      poVar4 = std::operator<<(poVar4,local_30);
      std::operator<<(poVar4,"\".");
      std::__cxx11::ostringstream::str();
      IssueMessage(this,INTERNAL_ERROR,(string *)local_3b8);
      std::__cxx11::string::~string((string *)local_3b8);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_398);
    }
    else {
      existingCxxStandard._7_1_ = 0;
      existingCxxStandard._6_1_ = 0;
      existingCxxStandard._5_1_ = 0;
      existingCxxStandard._4_1_ = 0;
      existingCxxStandard._3_1_ = 0;
      CheckNeededCxxLanguage
                (this,(string *)defaultCxxStandard,(bool *)((long)&existingCxxStandard + 7),
                 (bool *)((long)&existingCxxStandard + 6),(bool *)((long)&existingCxxStandard + 5),
                 (bool *)((long)&existingCxxStandard + 4),(bool *)((long)&existingCxxStandard + 3));
      psVar5 = feature_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3e8,"CXX_STANDARD",
                 (allocator<char> *)((long)&existingCxxLevel + 7));
      pcVar1 = cmTarget::GetProperty((cmTarget *)psVar5,&local_3e8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&existingCxxLevel + 7));
      local_3c8 = pcVar1;
      if (pcVar1 == (char *)0x0) {
        local_3c8 = local_30;
      }
      ppcVar2 = std::cbegin<char_const*[5]>(&CXX_STANDARDS);
      ppcVar3 = std::cend<char_const*[5]>(&CXX_STANDARDS);
      cmStrCmp::cmStrCmp(&local_418,local_3c8);
      ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_418);
      cmStrCmp::~cmStrCmp(&local_418);
      local_3f8 = ppcVar2;
      ppcVar3 = std::cend<char_const*[5]>(&CXX_STANDARDS);
      if (ppcVar2 == ppcVar3) {
        std::__cxx11::ostringstream::ostringstream(local_590);
        poVar4 = std::operator<<((ostream *)local_590,"The CXX_STANDARD property on target \"");
        psVar5 = cmTarget::GetName_abi_cxx11_((cmTarget *)feature_local);
        poVar4 = std::operator<<(poVar4,(string *)psVar5);
        poVar4 = std::operator<<(poVar4,"\" contained an invalid value: \"");
        poVar4 = std::operator<<(poVar4,local_3c8);
        std::operator<<(poVar4,"\".");
        std::__cxx11::ostringstream::str();
        IssueMessage(this,FATAL_ERROR,(string *)&needCxxLevel);
        std::__cxx11::string::~string((string *)&needCxxLevel);
        this_local._7_1_ = 0;
        std::__cxx11::ostringstream::~ostringstream(local_590);
      }
      else {
        if ((existingCxxStandard._3_1_ & 1) == 0) {
          if ((existingCxxStandard._4_1_ & 1) == 0) {
            if ((existingCxxStandard._5_1_ & 1) == 0) {
              if ((existingCxxStandard._6_1_ & 1) == 0) {
                local_6b8 = (char **)0x0;
                if ((existingCxxStandard._7_1_ & 1) != 0) {
                  local_6b8 = CXX_STANDARDS;
                }
              }
              else {
                local_6b8 = CXX_STANDARDS + 1;
              }
              local_6b0 = local_6b8;
            }
            else {
              local_6b0 = CXX_STANDARDS + 2;
            }
            local_6a8 = local_6b0;
          }
          else {
            local_6a8 = CXX_STANDARDS + 3;
          }
          local_6a0 = local_6a8;
        }
        else {
          local_6a0 = CXX_STANDARDS + 4;
        }
        local_6b9 = local_6a0 == (char **)0x0 || local_6a0 <= local_3f8;
        this_local._7_1_ = local_6b9;
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMakefile::HaveCxxStandardAvailable(cmTarget const* target,
                                          const std::string& feature) const
{
  const char* defaultCxxStandard =
    this->GetDefinition("CMAKE_CXX_STANDARD_DEFAULT");
  if (!defaultCxxStandard) {
    std::ostringstream e;
    e << "CMAKE_CXX_STANDARD_DEFAULT is not set.  COMPILE_FEATURES support "
         "not fully configured for this compiler.";
    this->IssueMessage(MessageType::INTERNAL_ERROR, e.str());
    // Return true so the caller does not try to lookup the default standard.
    return true;
  }
  if (std::find_if(cm::cbegin(CXX_STANDARDS), cm::cend(CXX_STANDARDS),
                   cmStrCmp(defaultCxxStandard)) == cm::cend(CXX_STANDARDS)) {
    std::ostringstream e;
    e << "The CMAKE_CXX_STANDARD_DEFAULT variable contains an "
         "invalid value: \""
      << defaultCxxStandard << "\".";
    this->IssueMessage(MessageType::INTERNAL_ERROR, e.str());
    return false;
  }

  bool needCxx98 = false;
  bool needCxx11 = false;
  bool needCxx14 = false;
  bool needCxx17 = false;
  bool needCxx20 = false;
  this->CheckNeededCxxLanguage(feature, needCxx98, needCxx11, needCxx14,
                               needCxx17, needCxx20);

  const char* existingCxxStandard = target->GetProperty("CXX_STANDARD");
  if (!existingCxxStandard) {
    existingCxxStandard = defaultCxxStandard;
  }

  const char* const* existingCxxLevel =
    std::find_if(cm::cbegin(CXX_STANDARDS), cm::cend(CXX_STANDARDS),
                 cmStrCmp(existingCxxStandard));
  if (existingCxxLevel == cm::cend(CXX_STANDARDS)) {
    std::ostringstream e;
    e << "The CXX_STANDARD property on target \"" << target->GetName()
      << "\" contained an invalid value: \"" << existingCxxStandard << "\".";
    this->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return false;
  }

  /* clang-format off */
  const char* const* needCxxLevel =
    needCxx20 ? &CXX_STANDARDS[4]
    : needCxx17 ? &CXX_STANDARDS[3]
    : needCxx14 ? &CXX_STANDARDS[2]
    : needCxx11 ? &CXX_STANDARDS[1]
    : needCxx98 ? &CXX_STANDARDS[0]
    : nullptr;
  /* clang-format on */

  return !needCxxLevel || needCxxLevel <= existingCxxLevel;
}